

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3UpsertDoUpdate(Parse *pParse,Upsert *pUpsert,Table *pTab,Index *pIdx,int iCur)

{
  ushort uVar1;
  sqlite3 *db;
  Index *pIVar2;
  byte bVar3;
  int iVar4;
  SrcList *pTabList;
  Op *pOVar5;
  Index **ppIVar6;
  ulong uVar7;
  int iVar8;
  short *psVar9;
  long lVar10;
  ulong uVar11;
  uint in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int p1;
  Vdbe *in_stack_ffffffffffffffb0;
  Vdbe *p;
  
  db = pParse->db;
  p1 = pUpsert->iDataCur;
  if (p1 != iCur && pIdx != (Index *)0x0) {
    p = pParse->pVdbe;
    if ((pTab->tabFlags & 0x20) == 0) {
      if (pParse->nTempReg == '\0') {
        iVar8 = pParse->nMem + 1;
        pParse->nMem = iVar8;
      }
      else {
        bVar3 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar3;
        iVar8 = pParse->aTempReg[bVar3];
      }
      in_stack_ffffffffffffffb0 = p;
      sqlite3VdbeAddOp3(p,0x87,iCur,iVar8,0);
      sqlite3VdbeAddOp3(p,0x1e,p1,0,iVar8);
      in_stack_ffffffffffffffac = p1;
      if (iVar8 != 0) {
        bVar3 = pParse->nTempReg;
        if ((ulong)bVar3 < 8) {
          pParse->nTempReg = bVar3 + 1;
          pParse->aTempReg[bVar3] = iVar8;
        }
      }
    }
    else {
      ppIVar6 = &pTab->pIndex;
      do {
        pIVar2 = *ppIVar6;
        ppIVar6 = &pIVar2->pNext;
      } while ((*(ushort *)&pIVar2->field_0x63 & 3) != 2);
      uVar1 = pIVar2->nKeyCol;
      iVar8 = pParse->nMem + 1;
      in_stack_ffffffffffffffa8 = (uint)uVar1;
      pParse->nMem = pParse->nMem + in_stack_ffffffffffffffa8;
      if (uVar1 != 0) {
        uVar7 = (ulong)in_stack_ffffffffffffffa8;
        uVar11 = 0;
        do {
          iVar4 = -1;
          if (pIdx->nColumn != 0) {
            psVar9 = pIdx->aiColumn;
            lVar10 = 0;
            do {
              if (*psVar9 == pIVar2->aiColumn[uVar11]) {
                iVar4 = (int)lVar10 >> 0x10;
                break;
              }
              lVar10 = lVar10 + 0x10000;
              psVar9 = psVar9 + 1;
            } while ((ulong)pIdx->nColumn * 0x10000 != lVar10);
          }
          sqlite3VdbeAddOp3(p,0x5a,iCur,iVar4,(int)uVar11 + iVar8);
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar7);
      }
      in_stack_ffffffffffffffb0 = p;
      iVar8 = sqlite3VdbeAddOp3(p,0x1d,p1,0,iVar8);
      if (p->db->mallocFailed == '\0') {
        pOVar5 = p->aOp;
        pOVar5[iVar8].p4type = -3;
        pOVar5[iVar8].p4.i = in_stack_ffffffffffffffa8;
      }
      iVar4 = sqlite3VdbeAddOp3(p,0x45,0xb,2,0);
      sqlite3VdbeChangeP4(p,iVar4,"corrupt database",-1);
      if (p->db->mallocFailed == '\0') {
        iVar4 = p->nOp + -1;
        if (-1 < iVar8) {
          iVar4 = iVar8;
        }
        pOVar5 = p->aOp + iVar4;
      }
      else {
        pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar5->p2 = p->nOp;
      in_stack_ffffffffffffffac = p1;
    }
  }
  pTabList = sqlite3SrcListDup(db,pUpsert->pUpsertSrc,0);
  sqlite3Update(pParse,pTabList,pUpsert->pUpsertSet,pUpsert->pUpsertWhere,2,(ExprList *)pUpsert,
                (Expr *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                (Upsert *)in_stack_ffffffffffffffb0);
  pUpsert->pUpsertSet = (ExprList *)0x0;
  pUpsert->pUpsertWhere = (Expr *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UpsertDoUpdate(
  Parse *pParse,        /* The parsing and code-generating context */
  Upsert *pUpsert,      /* The ON CONFLICT clause for the upsert */
  Table *pTab,          /* The table being updated */
  Index *pIdx,          /* The UNIQUE constraint that failed */
  int iCur              /* Cursor for pIdx (or pTab if pIdx==NULL) */
){
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;
  SrcList *pSrc;            /* FROM clause for the UPDATE */
  int iDataCur;

  assert( v!=0 );
  assert( pUpsert!=0 );
  VdbeNoopComment((v, "Begin DO UPDATE of UPSERT"));
  iDataCur = pUpsert->iDataCur;
  if( pIdx && iCur!=iDataCur ){
    if( HasRowid(pTab) ){
      int regRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iCur, regRowid);
      sqlite3VdbeAddOp3(v, OP_SeekRowid, iDataCur, 0, regRowid);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      int nPk = pPk->nKeyCol;
      int iPk = pParse->nMem+1;
      int i;
      pParse->nMem += nPk;
      for(i=0; i<nPk; i++){
        int k;
        assert( pPk->aiColumn[i]>=0 );
        k = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iCur, k, iPk+i);
        VdbeComment((v, "%s.%s", pIdx->zName,
                    pTab->aCol[pPk->aiColumn[i]].zName));
      }
      sqlite3VdbeVerifyAbortable(v, OE_Abort);
      i = sqlite3VdbeAddOp4Int(v, OP_Found, iDataCur, 0, iPk, nPk);
      VdbeCoverage(v);
      sqlite3VdbeAddOp4(v, OP_Halt, SQLITE_CORRUPT, OE_Abort, 0, 
            "corrupt database", P4_STATIC);
      sqlite3VdbeJumpHere(v, i);
    }
  }
  /* pUpsert does not own pUpsertSrc - the outer INSERT statement does.  So
  ** we have to make a copy before passing it down into sqlite3Update() */
  pSrc = sqlite3SrcListDup(db, pUpsert->pUpsertSrc, 0);
  sqlite3Update(pParse, pSrc, pUpsert->pUpsertSet,
      pUpsert->pUpsertWhere, OE_Abort, 0, 0, pUpsert);
  pUpsert->pUpsertSet = 0;    /* Will have been deleted by sqlite3Update() */
  pUpsert->pUpsertWhere = 0;  /* Will have been deleted by sqlite3Update() */
  VdbeNoopComment((v, "End DO UPDATE of UPSERT"));
}